

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

void Nf_ManFixPoDrivers(Nf_Man_t *p)

{
  Nf_Obj_t *pNVar1;
  undefined8 uVar2;
  int v;
  int iVar3;
  Gia_Obj_t *pObj;
  Gia_Obj_t *pGVar4;
  uint c;
  int i;
  int v_00;
  Nf_Mat_t *pM;
  undefined8 *puVar5;
  
  v_00 = 0;
  while( true ) {
    if (p->pGia->vCos->nSize <= v_00) {
      return;
    }
    pObj = Gia_ManCo(p->pGia,v_00);
    if (pObj == (Gia_Obj_t *)0x0) break;
    v = Gia_ObjFaninId0p(p->pGia,pObj);
    pGVar4 = Gia_ManObj(p->pGia,v);
    if ((((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) &&
        (iVar3 = Nf_ObjMapRefNum(p,v,0), iVar3 != 0)) &&
       (iVar3 = Nf_ObjMapRefNum(p,v,1), iVar3 != 0)) {
      c = *(uint *)pObj >> 0x1d & 1;
      pNVar1 = p->pNfObjs;
      if (((((&pNVar1[v].M[0][0].field_0x3)[c << 5] & 0x40) == 0) &&
          (puVar5 = (undefined8 *)(&pNVar1[v].M[0][0].field_0x0 + ((c ^ 1) << 5)),
          (*(byte *)((long)puVar5 + 3) & 0x40) == 0)) &&
         (p->InvDelayI + *(int *)(puVar5 + 1) <= p->pPars->MapDelay)) {
        pM = (Nf_Mat_t *)(&pNVar1[v].M[0][0].field_0x0 + (c << 5));
        Nf_MatchDeref_rec(p,v,c,pM);
        Nf_ObjMapRefInc(p,v,(uint)((*(uint *)pObj >> 0x1d & 1) == 0));
        uVar2 = puVar5[1];
        *(undefined8 *)pM = *puVar5;
        pM->D = (int)uVar2;
        pM->F = (float)(int)((ulong)uVar2 >> 0x20);
        pM->D = pM->D + p->InvDelayI;
        pM->field_0x3 = pM->field_0x3 | 0xc0;
        *(byte *)((long)puVar5 + 3) = *(byte *)((long)puVar5 + 3) | 0x80;
      }
    }
    v_00 = v_00 + 1;
  }
  return;
}

Assistant:

void Nf_ManFixPoDrivers( Nf_Man_t * p )
{
    Gia_Obj_t * pObj;
    Nf_Mat_t * pM, * pMc;
    int i, iDriver, Count = 0;
    Gia_ManForEachCo( p->pGia, pObj, i )
    {
        iDriver = Gia_ObjFaninId0p(p->pGia, pObj);
        if ( !Gia_ObjIsAnd(Gia_ManObj(p->pGia, iDriver)) )
            continue;
        // skip unless both are used
        if ( !Nf_ObjMapRefNum(p, iDriver, 0) || !Nf_ObjMapRefNum(p, iDriver, 1) )
            continue;
        pM  = Nf_ObjMatchD( p, iDriver,  Gia_ObjFaninC0(pObj) );
        pMc = Nf_ObjMatchD( p, iDriver, !Gia_ObjFaninC0(pObj) );
        // skip unless both are non-complemented
        if ( pM->fCompl || pMc->fCompl )
            continue;
        // skip if arrival time exceeds the required time
        if ( pMc->D + p->InvDelayI > p->pPars->MapDelay )
            continue;
        // update references
        Nf_MatchDeref_rec( p, iDriver, Gia_ObjFaninC0(pObj), pM );
        Nf_ObjMapRefInc( p, iDriver, !Gia_ObjFaninC0(pObj) );
        // add inverter
        *pM = *pMc;
        pM->D += p->InvDelayI;
        pM->fCompl = 1;
        pM->fBest = 1;
        pMc->fBest = 1;
        Count++;
    }
    //printf( "Fixed %d PO drivers.\n", Count );
}